

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void tcd_free_encode(opj_tcd_t *tcd)

{
  opj_tcd_tile_t *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  poVar1 = tcd->tcd_image->tiles;
  if (0 < poVar1->numcomps) {
    lVar7 = 0;
    do {
      poVar2 = poVar1->comps;
      iVar5 = poVar2[lVar7].numresolutions;
      if (0 < iVar5) {
        lVar8 = 0;
        do {
          poVar3 = poVar2[lVar7].resolutions;
          if (0 < poVar3[lVar8].numbands) {
            lVar6 = 0;
            do {
              if (0 < poVar3[lVar8].ph * poVar3[lVar8].pw) {
                lVar10 = 0;
                do {
                  poVar4 = poVar3[lVar8].bands[lVar6].precincts;
                  if (poVar4[lVar10].incltree != (opj_tgt_tree_t *)0x0) {
                    tgt_destroy(poVar4[lVar10].incltree);
                    poVar4[lVar10].incltree = (opj_tgt_tree_t *)0x0;
                  }
                  if (poVar4[lVar10].imsbtree != (opj_tgt_tree_t *)0x0) {
                    tgt_destroy(poVar4[lVar10].imsbtree);
                    poVar4[lVar10].imsbtree = (opj_tgt_tree_t *)0x0;
                  }
                  if (0 < poVar4[lVar10].ch * poVar4[lVar10].cw) {
                    lVar9 = 0;
                    lVar11 = 0;
                    do {
                      free((void *)(*(long *)((long)&(poVar4[lVar10].cblks.enc)->data + lVar9) + -2)
                          );
                      free(*(void **)((long)&(poVar4[lVar10].cblks.enc)->layers + lVar9));
                      free(*(void **)((long)&(poVar4[lVar10].cblks.enc)->passes + lVar9));
                      lVar11 = lVar11 + 1;
                      lVar9 = lVar9 + 0x40;
                    } while (lVar11 < (long)poVar4[lVar10].ch * (long)poVar4[lVar10].cw);
                  }
                  free(poVar4[lVar10].cblks.enc);
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (long)poVar3[lVar8].ph * (long)poVar3[lVar8].pw);
              }
              free(poVar3[lVar8].bands[lVar6].precincts);
              poVar3[lVar8].bands[lVar6].precincts = (opj_tcd_precinct_t *)0x0;
              lVar6 = lVar6 + 1;
            } while (lVar6 < poVar3[lVar8].numbands);
            iVar5 = poVar2[lVar7].numresolutions;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar5);
      }
      free(poVar2[lVar7].resolutions);
      poVar2[lVar7].resolutions = (opj_tcd_resolution_t *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < poVar1->numcomps);
  }
  free(poVar1->comps);
  poVar1->comps = (opj_tcd_tilecomp_t *)0x0;
  free(tcd->tcd_image->tiles);
  tcd->tcd_image->tiles = (opj_tcd_tile_t *)0x0;
  return;
}

Assistant:

void tcd_free_encode(opj_tcd_t *tcd) {
	int tileno, compno, resno, bandno, precno, cblkno;

	for (tileno = 0; tileno < 1; tileno++) {
		opj_tcd_tile_t *tile = tcd->tcd_image->tiles;

		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];

			for (resno = 0; resno < tilec->numresolutions; resno++) {
				opj_tcd_resolution_t *res = &tilec->resolutions[resno];

				for (bandno = 0; bandno < res->numbands; bandno++) {
					opj_tcd_band_t *band = &res->bands[bandno];

					for (precno = 0; precno < res->pw * res->ph; precno++) {
						opj_tcd_precinct_t *prc = &band->precincts[precno];

						if (prc->incltree != NULL) {
							tgt_destroy(prc->incltree);
							prc->incltree = NULL;
						}
						if (prc->imsbtree != NULL) {
							tgt_destroy(prc->imsbtree);	
							prc->imsbtree = NULL;
						}
						for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
							opj_free(prc->cblks.enc[cblkno].data - 2);
							opj_free(prc->cblks.enc[cblkno].layers);
							opj_free(prc->cblks.enc[cblkno].passes);
						}
						opj_free(prc->cblks.enc);
					} /* for (precno */
					opj_free(band->precincts);
					band->precincts = NULL;
				} /* for (bandno */
			} /* for (resno */
			opj_free(tilec->resolutions);
			tilec->resolutions = NULL;
		} /* for (compno */
		opj_free(tile->comps);
		tile->comps = NULL;
	} /* for (tileno */
	opj_free(tcd->tcd_image->tiles);
	tcd->tcd_image->tiles = NULL;
}